

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O2

int CVmObjList::getp_subset(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *argc)

{
  vm_val_t *funcptr;
  CVmObjPageEntry *this;
  ushort uVar1;
  ushort *lst_00;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_val_t *pvVar4;
  int iVar5;
  vm_obj_id_t vVar6;
  ulong uVar7;
  uint16_t tmp;
  size_t idx;
  vm_val_t ele;
  vm_rcdesc rc;
  
  if ((getp_subset(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') &&
     (iVar5 = __cxa_guard_acquire(&getp_subset(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)
                                   ::desc), iVar5 != 0)) {
    getp_subset::desc.min_argc_ = 1;
    getp_subset::desc.opt_argc_ = 0;
    getp_subset::desc.varargs_ = 0;
    __cxa_guard_release(&getp_subset(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc);
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,argc,&getp_subset::desc);
  if (iVar5 == 0) {
    vm_rcdesc::init(&rc,(EVP_PKEY_CTX *)"List.subset");
    pvVar4 = sp_;
    funcptr = sp_ + -1;
    uVar3 = *(undefined4 *)&self_val->field_0x4;
    aVar2 = self_val->val;
    sp_ = sp_ + 1;
    pvVar4->typ = self_val->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    idx = 0;
    vVar6 = create(0,lst);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar6;
    pvVar4 = sp_;
    this = G_obj_table_X.pages_[vVar6 >> 0xc] + (vVar6 & 0xfff);
    lst_00 = *(ushort **)((long)&G_obj_table_X.pages_[vVar6 >> 0xc][vVar6 & 0xfff].ptr_ + 8);
    uVar1 = *lst_00;
    uVar3 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar4->typ = retval->typ;
    *(undefined4 *)&pvVar4->field_0x4 = uVar3;
    pvVar4->val = aVar2;
    for (uVar7 = 0; uVar1 != uVar7; uVar7 = uVar7 + 1) {
      index_list(&ele,(char *)lst_00,(int)uVar7 + 1);
      pvVar4 = sp_;
      sp_ = sp_ + 1;
      pvVar4->typ = ele.typ;
      *(undefined4 *)&pvVar4->field_0x4 = ele._4_4_;
      pvVar4->val = ele.val;
      CVmRun::call_func_ptr(&G_interpreter_X,funcptr,1,&rc,0);
      if ((r0_.typ != VM_NIL) && ((r0_.typ != VM_INT || (r0_.val.obj != 0)))) {
        cons_set_element((CVmObjList *)this,idx,&ele);
        idx = idx + 1;
      }
    }
    *(short *)*(char **)((long)&this->ptr_ + 8) = (short)idx;
    sp_ = sp_ + -3;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_subset(VMG_ vm_val_t *retval, const vm_val_t *self_val,
                            const char *lst, uint *argc)
{
    uint orig_argc = (argc != 0 ? *argc : 0);
    const vm_val_t *func_val;
    size_t src;
    size_t dst;
    size_t cnt;
    char *new_lst;
    CVmObjList *new_lst_obj;
    static CVmNativeCodeDesc desc(1);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* set up the recursive caller context */
    vm_rcdesc rc(vmg_ "List.subset", self_val, 1, G_stk->get(0), orig_argc);

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while allocating to protect from gc */
    G_stk->push(self_val);

    /* 
     *   Make a copy of our list for the return value.  The result value
     *   will be at most the same size as our current list; since we have
     *   no way of knowing exactly how large it will be, and since we
     *   don't want to run through the selection functions twice, we'll
     *   just allocate at the maximum size and leave it partially unused
     *   if we don't need all of the space.  By making a copy of the input
     *   list, we also can avoid worrying about whether the input list was
     *   a constant, and hence we don't have to worry about the
     *   possibility of constant page swapping.  
     */
    retval->set_obj(create(vmg_ FALSE, lst));

    /* get the return value list data */
    new_lst_obj = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
    new_lst = new_lst_obj->ext_;

    /* get the length of the list */
    cnt = vmb_get_len(new_lst);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our list, and invoke the callback on
     *   each element.  If the element passes, write it to the current
     *   output location in the list; otherwise, just skip it.
     *   
     *   Note that we're using the same list as source and destination,
     *   which is easy because the list will either shrink or stay the
     *   same - we'll never need to insert new elements.  
     */
    for (src = dst = 0 ; src < cnt ; ++src)
    {
        vm_val_t ele;
        const vm_val_t *val;
        
        /* 
         *   get this element (using a 1-based index), and push it as the
         *   callback's argument 
         */
        index_list(vmg_ &ele, new_lst, src + 1);
        G_stk->push(&ele);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* get the result from R0 */
        val = G_interpreter->get_r0();

        /* 
         *   if the callback returned non-nil and non-zero, include this
         *   element in the result 
         */
        if (val->typ == VM_NIL
            || (val->typ == VM_INT && val->val.intval == 0))
        {
            /* it's nil or zero - don't include it in the result */
        }
        else
        {
            /* include this element in the result */
            new_lst_obj->cons_set_element(dst, &ele);

            /* advance the output index */
            ++dst;
        }
    }

    /* 
     *   set the result list length to the number of elements we actually
     *   copied 
     */
    new_lst_obj->cons_set_len(dst);

    /* discard our gc protection (self, return value) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}